

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PresolveComponent.cpp
# Opt level: O2

void __thiscall PresolveComponent::negateReducedLpColDuals(PresolveComponent *this)

{
  int iVar1;
  pointer pdVar2;
  HighsInt col;
  long lVar3;
  
  iVar1 = (this->data_).reduced_lp_.num_col_;
  pdVar2 = (this->data_).recovered_solution_.col_dual.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
    pdVar2[lVar3] = -pdVar2[lVar3];
  }
  return;
}

Assistant:

void PresolveComponent::negateReducedLpColDuals() {
  for (HighsInt col = 0; col < data_.reduced_lp_.num_col_; col++)
    data_.recovered_solution_.col_dual[col] =
        -data_.recovered_solution_.col_dual[col];
  return;
}